

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContainerRequirementsDocs.cpp
# Opt level: O0

void __thiscall
VerifyAllCombinationsOnContainer::MinimalContainerInterfaceForVerifyAllCombinations::
MinimalContainerInterfaceForVerifyAllCombinations
          (MinimalContainerInterfaceForVerifyAllCombinations *this)

{
  deque<int,_std::allocator<int>_> *in_RDI;
  value_type_conflict2 *in_stack_ffffffffffffffc8;
  
  std::deque<int,_std::allocator<int>_>::deque((deque<int,_std::allocator<int>_> *)0x186a98);
  std::deque<int,_std::allocator<int>_>::push_back(in_RDI,in_stack_ffffffffffffffc8);
  std::deque<int,_std::allocator<int>_>::push_back(in_RDI,in_stack_ffffffffffffffc8);
  std::deque<int,_std::allocator<int>_>::push_back(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

MinimalContainerInterfaceForVerifyAllCombinations()
        {
            push_back(10);
            push_back(20);
            push_back(30);
        }